

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

Header * __thiscall Imf_2_5::Header::operator=(Header *this,Header *other)

{
  _Rb_tree_header *__last;
  const_iterator __first;
  _Rb_tree_node_base *p_Var1;
  
  if (this != other) {
    __first._M_node = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    __last = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__first._M_node != __last) {
      do {
        if (*(long **)(__first._M_node + 9) != (long *)0x0) {
          (**(code **)(**(long **)(__first._M_node + 9) + 8))();
        }
        __first._M_node = (_Base_ptr)std::_Rb_tree_increment(__first._M_node);
      } while ((_Rb_tree_header *)__first._M_node != __last);
      __first._M_node = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
    ::_M_erase_aux((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                    *)this,__first,(const_iterator)__last);
    for (p_Var1 = (other->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(other->_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      insert(this,(char *)(p_Var1 + 1),*(Attribute **)(p_Var1 + 9));
    }
  }
  return this;
}

Assistant:

Header &		
Header::operator = (const Header &other)
{
    if (this != &other)
    {
	for (AttributeMap::iterator i = _map.begin();
	     i != _map.end();
	     ++i)
	{
	     delete i->second;
	}

	_map.erase (_map.begin(), _map.end());

	for (AttributeMap::const_iterator i = other._map.begin();
	     i != other._map.end();
	     ++i)
	{
	    insert (*i->first, *i->second);
	}
    }

    return *this;
}